

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QList<QVariant> * subControlLayout(QByteArrayView layout)

{
  const_iterator pvVar1;
  QList<QVariant> *this;
  QList<QVariant> *in_RDI;
  long in_FS_OFFSET;
  int button;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArrayView *__range1;
  QList<QVariant> *buttons;
  rvalue_ref in_stack_fffffffffffffe18;
  QByteArrayView *in_stack_fffffffffffffe20;
  char *local_1b8;
  QVariant local_188;
  QVariant local_168;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QVariant>::QList((QList<QVariant> *)0x4201ee);
  local_1b8 = QByteArrayView::begin((QByteArrayView *)0x420211);
  pvVar1 = QByteArrayView::end(in_stack_fffffffffffffe20);
  for (; local_1b8 != pvVar1; local_1b8 = local_1b8 + 1) {
    this = (QList<QVariant> *)(ulong)((int)*local_1b8 - 0x48);
    switch(this) {
    case (QList<QVariant> *)0x0:
      QVariant::QVariant(&local_148,0x48);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_148);
      break;
    case (QList<QVariant> *)0x1:
      QVariant::QVariant(&local_108,0x49);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_108);
      break;
    default:
      QVariant::QVariant(&local_188,(int)*local_1b8);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_188);
      break;
    case (QList<QVariant> *)0x5:
      QVariant::QVariant(&local_68,0x44);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_68);
      break;
    case (QList<QVariant> *)0x6:
      QVariant::QVariant(&local_c8,0x40);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_c8);
      QVariant::QVariant(&local_e8,0x47);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_e8);
      break;
    case (QList<QVariant> *)0xb:
      QVariant::QVariant(&local_168,0x45);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_168);
      break;
    case (QList<QVariant> *)0xc:
      QVariant::QVariant(&local_128,0x41);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_128);
      break;
    case (QList<QVariant> *)0x10:
      QVariant::QVariant(&local_88,0x3e);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_88);
      QVariant::QVariant(&local_a8,0x42);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_a8);
      break;
    case (QList<QVariant> *)0x25:
      QVariant::QVariant(&local_28,0x3f);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_28);
      QVariant::QVariant(&local_48,0x43);
      QList<QVariant>::append(this,in_stack_fffffffffffffe18);
      QVariant::~QVariant(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QList<QVariant> subControlLayout(QByteArrayView layout)
{
    QList<QVariant> buttons;
    for (int button : layout) {
        switch (button) {
        case 'm':
            buttons.append(PseudoElement_MdiMinButton);
            buttons.append(PseudoElement_TitleBarMinButton);
            break;
        case 'M':
            buttons.append(PseudoElement_TitleBarMaxButton);
            break;
        case 'X':
            buttons.append(PseudoElement_MdiCloseButton);
            buttons.append(PseudoElement_TitleBarCloseButton);
            break;
        case 'N':
            buttons.append(PseudoElement_MdiNormalButton);
            buttons.append(PseudoElement_TitleBarNormalButton);
            break;
        case 'I':
            buttons.append(PseudoElement_TitleBarSysMenu);
            break;
        case 'T':
            buttons.append(PseudoElement_TitleBar);
            break;
        case 'H':
            buttons.append(PseudoElement_TitleBarContextHelpButton);
            break;
        case 'S':
            buttons.append(PseudoElement_TitleBarShadeButton);
            break;
        default:
            buttons.append(button);
            break;
        }
    }
    return buttons;
}